

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_src_generic_fp(int count,QT_FT_Span *spans,void *userData)

{
  bool bVar1;
  QLoggingCategory *in_RDX;
  char *in_RSI;
  undefined4 in_EDI;
  long in_FS_OFFSET;
  QSpanData *data;
  Operator op;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *this;
  undefined4 in_stack_ffffffffffffff10;
  char local_e8 [12];
  int in_stack_ffffffffffffff24;
  QT_FT_Span *in_stack_ffffffffffffff28;
  QSpanData *in_stack_ffffffffffffff30;
  QSpanData *in_stack_ffffffffffffff38;
  QT_FT_Span *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  long local_70;
  long local_60;
  long local_50;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDX;
  memcpy(&stack0xffffffffffffff38,&DAT_00bfdff0,0xb0);
  getOperator(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
  if (((local_50 == 0) || (local_70 == 0)) || (local_60 == 0)) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiDrawHelper();
    anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this,in_RDX);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xb441c0);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_EDI,in_stack_ffffffffffffff10),in_RSI,
                 (int)((ulong)this >> 0x20),(char *)in_RDX,(char *)0xb441d6);
      QMessageLogger::debug
                (local_e8,
                 "blend_src_generic_fp: unsupported 4xFP blend attempted, falling back to 32-bit");
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    handleSpans<BlendSrcGeneric>
              (in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (Operator *)in_stack_ffffffffffffff30);
  }
  else {
    handleSpans<BlendSrcGenericRGBFP>
              (in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (Operator *)in_stack_ffffffffffffff30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_src_generic_fp(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    const Operator op = getOperator(data, spans, count);
    if (op.funcFP && op.destFetchFP && op.srcFetchFP) {
        handleSpans<BlendSrcGenericRGBFP>(count, spans, data, op);
    } else {
        qCDebug(lcQtGuiDrawHelper, "blend_src_generic_fp: unsupported 4xFP blend attempted, falling back to 32-bit");
        handleSpans<BlendSrcGeneric>(count, spans, data, op);
    }
}